

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Probe(int source,int tag,MPIABI_Comm comm,MPIABI_Status *status)

{
  int iVar1;
  ompi_communicator_t *poVar2;
  MPI_Status *pMVar3;
  WPI_StatusPtr local_30;
  WPI_Handle local_28 [8];
  MPIABI_Status *local_20;
  MPIABI_Status *status_local;
  MPIABI_Comm comm_local;
  int tag_local;
  int source_local;
  
  local_20 = status;
  status_local = (MPIABI_Status *)comm;
  comm_local._0_4_ = tag;
  comm_local._4_4_ = source;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle((WPI_Handle<ompi_communicator_t_*> *)local_28,comm);
  poVar2 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_28);
  WPI_StatusPtr::WPI_StatusPtr(&local_30,local_20);
  pMVar3 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_30);
  iVar1 = MPI_Probe(source,tag,poVar2,pMVar3);
  WPI_StatusPtr::~WPI_StatusPtr(&local_30);
  return iVar1;
}

Assistant:

int MPIABI_Probe(
  int source,
  int tag,
  MPIABI_Comm comm,
  MPIABI_Status * status
) {
  return MPI_Probe(
    source,
    tag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}